

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_55dd6::SetSourcefv
          (anon_unknown_dwarf_55dd6 *this,ALsource *Source,ALCcontext *Context,SourceProp prop,
          span<const_float,_18446744073709551615UL> values)

{
  float fVar1;
  uint uVar2;
  bool bVar3;
  undefined4 in_register_0000000c;
  float *pfVar4;
  ALCcontext *Context_00;
  int OffsetType;
  char *msg;
  byte unaff_BPL;
  ALenum errorCode;
  pointer pfVar5;
  undefined8 uVar6;
  pointer piVar7;
  Voice *oldvoice;
  span<const_int,_18446744073709551615UL> values_00;
  int ival;
  uint local_60;
  int local_5c;
  VoicePos local_58;
  optional<(anonymous_namespace)::VoicePos> local_48;
  
  pfVar4 = (float *)CONCAT44(in_register_0000000c,prop);
  pfVar5 = values.mData;
  OffsetType = (int)Context;
  Context_00 = (ALCcontext *)((ulong)Context & 0xffffffff);
  if (0x1200 < OffsetType) {
    if (OffsetType < 0xc000) {
      if (0x1211 < OffsetType) {
        if ((OffsetType == 0x1212) || (OffsetType == 0x1214)) goto switchD_00123044_caseD_1007;
        goto switchD_00123044_caseD_1008;
      }
      if ((OffsetType != 0x1201) && (OffsetType != 0x1203)) goto switchD_00123044_caseD_1008;
      msg = "Setting read-only source property 0x%04x";
      errorCode = 0xa004;
      goto LAB_0012329b;
    }
    switch(OffsetType) {
    case 0x20007:
      piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
      if ((piVar7 == (pointer)0x1) || (piVar7 == (pointer)0x6)) {
        fVar1 = *pfVar4;
        if ((fVar1 < 0.0) || (10.0 < fVar1)) goto LAB_00123952;
        *(float *)(this + 0x7c) = fVar1;
        goto LAB_001238ce;
      }
      Context_00 = (ALCcontext *)0x20007;
      break;
    case 0x20008:
      piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
      if ((piVar7 == (pointer)0x1) || (piVar7 == (pointer)0x6)) {
        fVar1 = *pfVar4;
        if ((fVar1 < 0.0) || (10.0 < fVar1)) goto LAB_00123952;
        *(float *)(this + 0x80) = fVar1;
        goto LAB_001238ce;
      }
      Context_00 = (ALCcontext *)0x20008;
      break;
    case 0x20009:
      piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
      if ((piVar7 == (pointer)0x1) || (piVar7 == (pointer)0x6)) {
        fVar1 = *pfVar4;
        if ((fVar1 < 0.0) || (1.0 < fVar1)) goto LAB_00123952;
        *(float *)(this + 0x78) = fVar1;
        goto LAB_001238ce;
      }
      Context_00 = (ALCcontext *)0x20009;
      break;
    case 0x2000a:
    case 0x2000b:
    case 0x2000c:
      goto switchD_00123044_caseD_1007;
    default:
      if (OffsetType != 0xc000) {
        if (OffsetType != 0xd000) goto switchD_00123044_caseD_1008;
        goto switchD_00123044_caseD_1007;
      }
      piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
      if ((piVar7 == (pointer)0x1) || (piVar7 == (pointer)0x6)) {
        fVar1 = *pfVar4;
        if ((fVar1 < 0.0) || (1.0 < fVar1)) goto LAB_00123952;
        *(float *)(this + 0x84) = fVar1;
        goto LAB_001238ce;
      }
      Context_00 = (ALCcontext *)0xc000;
    }
    goto LAB_00123983;
  }
  switch(OffsetType) {
  case 0x1001:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1001;
      goto LAB_00123983;
    }
    fVar1 = *pfVar4;
    if ((fVar1 < 0.0) || (360.0 < fVar1)) {
LAB_00123952:
      unaff_BPL = 0;
      ALCcontext::setError((ALCcontext *)Source,0xa003,"Value out of range");
      goto LAB_001238dc;
    }
    *(float *)(this + 0x14) = fVar1;
    break;
  case 0x1002:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1002;
      goto LAB_00123983;
    }
    fVar1 = *pfVar4;
    if ((fVar1 < 0.0) || (360.0 < fVar1)) goto LAB_00123952;
    *(float *)(this + 0x18) = fVar1;
    break;
  case 0x1003:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1003;
      goto LAB_00123983;
    }
    if (*pfVar4 < 0.0) goto LAB_00123952;
    *(float *)this = *pfVar4;
    break;
  case 0x1004:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if ((piVar7 == (pointer)0x3) || (piVar7 == (pointer)0x6)) {
      if ((0x7f7fffff < (uint)ABS(*pfVar4)) ||
         ((0x7f7fffff < (uint)ABS(pfVar4[1]) || (0x7f7fffff < (uint)ABS(pfVar4[2])))))
      goto LAB_00123952;
      *(float *)(this + 0x28) = *pfVar4;
      *(float *)(this + 0x2c) = pfVar4[1];
      *(float *)(this + 0x30) = pfVar4[2];
      break;
    }
    Context_00 = (ALCcontext *)0x1004;
LAB_00123a57:
    uVar6 = 3;
    goto LAB_00123911;
  case 0x1005:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if ((piVar7 != (pointer)0x3) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1005;
      goto LAB_00123a57;
    }
    if (((0x7f7fffff < (uint)ABS(*pfVar4)) || (0x7f7fffff < (uint)ABS(pfVar4[1]))) ||
       (0x7f7fffff < (uint)ABS(pfVar4[2]))) goto LAB_00123952;
    *(float *)(this + 0x40) = *pfVar4;
    *(float *)(this + 0x44) = pfVar4[1];
    *(float *)(this + 0x48) = pfVar4[2];
    break;
  case 0x1006:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if ((piVar7 != (pointer)0x3) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1006;
      goto LAB_00123a57;
    }
    if (((0x7f7fffff < (uint)ABS(*pfVar4)) || (0x7f7fffff < (uint)ABS(pfVar4[1]))) ||
       (0x7f7fffff < (uint)ABS(pfVar4[2]))) goto LAB_00123952;
    *(float *)(this + 0x34) = *pfVar4;
    *(float *)(this + 0x38) = pfVar4[1];
    *(float *)(this + 0x3c) = pfVar4[2];
    break;
  case 0x1007:
  case 0x1010:
  case 0x1027:
  case 0x1033:
    goto switchD_00123044_caseD_1007;
  case 0x1008:
  case 0x1009:
  case 0x100b:
  case 0x100c:
  case 0x1011:
  case 0x1012:
  case 0x1013:
  case 0x1014:
  case 0x1017:
  case 0x1018:
  case 0x1019:
  case 0x101a:
  case 0x101b:
  case 0x101c:
  case 0x101d:
  case 0x101e:
  case 0x101f:
  case 0x1028:
  case 0x1029:
  case 0x102a:
  case 0x102b:
  case 0x102c:
  case 0x102d:
  case 0x102e:
  case 0x102f:
  case 0x1032:
switchD_00123044_caseD_1008:
    if (0 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected property: 0x%04x\n",Context_00);
    }
    msg = "Invalid source float property 0x%04x";
    errorCode = 0xa002;
LAB_0012329b:
    unaff_BPL = 0;
    ALCcontext::setError((ALCcontext *)Source,errorCode,msg,Context_00);
    goto LAB_001238dc;
  case 0x100a:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x100a;
      goto LAB_00123983;
    }
    if (*pfVar4 < 0.0) goto LAB_00123952;
    *(float *)(this + 4) = *pfVar4;
    break;
  case 0x100d:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x100d;
      goto LAB_00123983;
    }
    if (*pfVar4 < 0.0) goto LAB_00123952;
    *(float *)(this + 0xc) = *pfVar4;
    break;
  case 0x100e:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x100e;
      goto LAB_00123983;
    }
    if (*pfVar4 < 0.0) goto LAB_00123952;
    *(float *)(this + 0x10) = *pfVar4;
    break;
  case 0x100f:
    if ((long)pfVar5 - (long)pfVar4 != 0x18) {
      piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
      Context_00 = (ALCcontext *)0x100f;
      uVar6 = 6;
      goto LAB_00123911;
    }
    if (((((0x7f7fffff < (uint)ABS(*pfVar4)) || (0x7f7fffff < (uint)ABS(pfVar4[1]))) ||
         (0x7f7fffff < (uint)ABS(pfVar4[2]))) ||
        ((0x7f7fffff < (uint)ABS(pfVar4[3]) || (0x7f7fffff < (uint)ABS(pfVar4[4]))))) ||
       (0x7f7fffff < (uint)ABS(pfVar4[5]))) goto LAB_00123952;
    *(float *)(this + 0x4c) = *pfVar4;
    *(float *)(this + 0x50) = pfVar4[1];
    *(float *)(this + 0x54) = pfVar4[2];
    *(float *)(this + 0x58) = pfVar4[3];
    *(float *)(this + 0x5c) = pfVar4[4];
    *(float *)(this + 0x60) = pfVar4[5];
    break;
  case 0x1015:
  case 0x1016:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) goto LAB_00123983;
    local_60 = (uint)(long)*pfVar4;
    goto LAB_00123214;
  case 0x1020:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1020;
      goto LAB_00123983;
    }
    if (*pfVar4 < 0.0) goto LAB_00123952;
    *(float *)(this + 0x1c) = *pfVar4;
    break;
  case 0x1021:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1021;
      goto LAB_00123983;
    }
    if (*pfVar4 < 0.0) goto LAB_00123952;
    *(float *)(this + 0x24) = *pfVar4;
    break;
  case 0x1022:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1022;
      goto LAB_00123983;
    }
    fVar1 = *pfVar4;
    if ((fVar1 < 0.0) || (1.0 < fVar1)) goto LAB_00123952;
    *(float *)(this + 8) = fVar1;
    break;
  case 0x1023:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1023;
      goto LAB_00123983;
    }
    if (*pfVar4 < 0.0) goto LAB_00123952;
    *(float *)(this + 0x20) = *pfVar4;
    break;
  case 0x1024:
  case 0x1025:
  case 0x1026:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) goto LAB_00123983;
    if (*pfVar4 < 0.0) goto LAB_00123952;
    if ((*(ulong *)&(Source->Send)._M_elems[5].LFReference <= (ulong)*(uint *)(this + 0x18c)) ||
       (oldvoice = *(Voice **)
                    (*(long *)&(Source->Send)._M_elems[5].HFReference + 8 +
                    (ulong)*(uint *)(this + 0x18c) * 8),
       (oldvoice->mSourceID).super___atomic_base<unsigned_int>._M_i != *(__int_type *)(this + 400)))
    {
      *(undefined4 *)(this + 0x18c) = 0xffffffff;
      oldvoice = (Voice *)0x0;
    }
    if (oldvoice == (Voice *)0x0) {
      bVar3 = true;
    }
    else if ((oldvoice->mFlags & 2) == 0) {
      GetSampleOffset(&local_48,*(BufferlistItem **)(this + 0x180),OffsetType,(double)*pfVar4);
      uVar2 = local_60;
      local_60 = local_60 & 0xffffff00;
      local_58.pos = 0;
      local_58.frac = 0;
      local_58.bufferitem = (BufferlistItem *)0x0;
      if (local_48.mHasValue == true) {
        local_58.pos = local_48.field_1.mValue.pos;
        local_58.frac = local_48.field_1.mValue.frac;
        local_58.bufferitem = local_48.field_1.mValue.bufferitem;
        local_60 = CONCAT31(SUB43(uVar2,1),1);
      }
      unaff_BPL = (byte)local_60;
      if ((byte)local_60 == 0) {
        bVar3 = false;
        ALCcontext::setError((ALCcontext *)Source,0xa003,"Invalid offset");
      }
      else {
        bVar3 = SetVoiceOffset(oldvoice,&local_58,(ALsource *)this,(ALCcontext *)Source,
                               *(ALCdevice **)&Source[1].mDistanceModel);
        bVar3 = !bVar3;
      }
    }
    else {
      bVar3 = false;
      ALCcontext::setError((ALCcontext *)Source,0xa003,"Source offset for callback is invalid");
      unaff_BPL = 0;
    }
    if (!bVar3) goto LAB_001238dc;
    *(int *)(this + 0x170) = OffsetType;
    *(double *)(this + 0x168) = (double)*pfVar4;
    goto LAB_001238d9;
  case 0x1030:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if (((ulong)piVar7 | 4) != 6) {
      Context_00 = (ALCcontext *)0x1030;
      uVar6 = 2;
      goto LAB_00123911;
    }
    if ((0x7f7fffff < (uint)ABS(*pfVar4)) || (0x7f7fffff < (uint)ABS(pfVar4[1]))) goto LAB_00123952;
    *(float *)(this + 0x88) = *pfVar4;
    *(float *)(this + 0x8c) = pfVar4[1];
    break;
  case 0x1031:
    piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
    if ((piVar7 != (pointer)0x1) && (piVar7 != (pointer)0x6)) {
      Context_00 = (ALCcontext *)0x1031;
      goto LAB_00123983;
    }
    fVar1 = *pfVar4;
    if ((0x7effffff < (int)ABS(fVar1) - 0x800000U || (int)fVar1 < 0) &&
        (ABS(fVar1) != 0.0 && 0x7ffffe < (int)fVar1 - 1U)) goto LAB_00123952;
    *(float *)(this + 0x90) = fVar1;
    break;
  default:
    if (OffsetType != 0x202) goto switchD_00123044_caseD_1008;
    goto switchD_00123044_caseD_1007;
  }
LAB_001238ce:
  UpdateSourceProps((ALsource *)this,(ALCcontext *)Source);
LAB_001238d9:
  unaff_BPL = 1;
LAB_001238dc:
  return (bool)(unaff_BPL & 1);
switchD_00123044_caseD_1007:
  piVar7 = (pointer)((long)pfVar5 - (long)pfVar4 >> 2);
  if ((piVar7 == (pointer)0x1) || (piVar7 == (pointer)0x6)) {
    local_60 = (uint)*pfVar4;
LAB_00123214:
    values_00.mData = &local_5c;
    values_00.mDataEnd = piVar7;
    unaff_BPL = SetSourceiv(this,Source,Context_00,(SourceProp)&local_60,values_00);
  }
  else {
LAB_00123983:
    uVar6 = 1;
LAB_00123911:
    unaff_BPL = 0;
    ALCcontext::setError
              ((ALCcontext *)Source,0xa002,"Property 0x%04x expects %d value(s), got %zu",Context_00
               ,uVar6,piVar7);
  }
  goto LAB_001238dc;
}

Assistant:

bool SetSourcefv(ALsource *Source, ALCcontext *Context, SourceProp prop, const al::span<const float> values)
{
    int ival;

    switch(prop)
    {
    case AL_SEC_OFFSET_LATENCY_SOFT:
    case AL_SEC_OFFSET_CLOCK_SOFT:
        /* Query only */
        SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
            "Setting read-only source property 0x%04x", prop);

    case AL_PITCH:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->Pitch = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_CONE_INNER_ANGLE:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 360.0f);

        Source->InnerAngle = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_CONE_OUTER_ANGLE:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 360.0f);

        Source->OuterAngle = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_GAIN:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->Gain = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_MAX_DISTANCE:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->MaxDistance = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_ROLLOFF_FACTOR:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->RolloffFactor = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_REFERENCE_DISTANCE:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->RefDistance = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_MIN_GAIN:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->MinGain = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_MAX_GAIN:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->MaxGain = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_CONE_OUTER_GAIN:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 1.0f);

        Source->OuterGain = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_CONE_OUTER_GAINHF:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 1.0f);

        Source->OuterGainHF = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_AIR_ABSORPTION_FACTOR:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 10.0f);

        Source->AirAbsorptionFactor = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_ROOM_ROLLOFF_FACTOR:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 10.0f);

        Source->RoomRolloffFactor = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_DOPPLER_FACTOR:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 1.0f);

        Source->DopplerFactor = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_SEC_OFFSET:
    case AL_SAMPLE_OFFSET:
    case AL_BYTE_OFFSET:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        if(Voice *voice{GetSourceVoice(Source, Context)})
        {
            if((voice->mFlags&VoiceIsCallback))
                SETERR_RETURN(Context, AL_INVALID_VALUE, false,
                    "Source offset for callback is invalid");
            auto vpos = GetSampleOffset(Source->queue, prop, values[0]);
            if(!vpos) SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid offset");

            if(SetVoiceOffset(voice, *vpos, Source, Context, Context->mDevice.get()))
                return true;
        }
        Source->OffsetType = prop;
        Source->Offset = values[0];
        return true;

    case AL_SOURCE_RADIUS:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && std::isfinite(values[0]));

        Source->Radius = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_STEREO_ANGLES:
        CHECKSIZE(values, 2);
        CHECKVAL(std::isfinite(values[0]) && std::isfinite(values[1]));

        Source->StereoPan[0] = values[0];
        Source->StereoPan[1] = values[1];
        return UpdateSourceProps(Source, Context);


    case AL_POSITION:
        CHECKSIZE(values, 3);
        CHECKVAL(std::isfinite(values[0]) && std::isfinite(values[1]) && std::isfinite(values[2]));

        Source->Position[0] = values[0];
        Source->Position[1] = values[1];
        Source->Position[2] = values[2];
        return UpdateSourceProps(Source, Context);

    case AL_VELOCITY:
        CHECKSIZE(values, 3);
        CHECKVAL(std::isfinite(values[0]) && std::isfinite(values[1]) && std::isfinite(values[2]));

        Source->Velocity[0] = values[0];
        Source->Velocity[1] = values[1];
        Source->Velocity[2] = values[2];
        return UpdateSourceProps(Source, Context);

    case AL_DIRECTION:
        CHECKSIZE(values, 3);
        CHECKVAL(std::isfinite(values[0]) && std::isfinite(values[1]) && std::isfinite(values[2]));

        Source->Direction[0] = values[0];
        Source->Direction[1] = values[1];
        Source->Direction[2] = values[2];
        return UpdateSourceProps(Source, Context);

    case AL_ORIENTATION:
        CHECKSIZE(values, 6);
        CHECKVAL(std::isfinite(values[0]) && std::isfinite(values[1]) && std::isfinite(values[2])
            && std::isfinite(values[3]) && std::isfinite(values[4]) && std::isfinite(values[5]));

        Source->OrientAt[0] = values[0];
        Source->OrientAt[1] = values[1];
        Source->OrientAt[2] = values[2];
        Source->OrientUp[0] = values[3];
        Source->OrientUp[1] = values[4];
        Source->OrientUp[2] = values[5];
        return UpdateSourceProps(Source, Context);


    case AL_SOURCE_RELATIVE:
    case AL_LOOPING:
    case AL_SOURCE_STATE:
    case AL_SOURCE_TYPE:
    case AL_DISTANCE_MODEL:
    case AL_DIRECT_FILTER_GAINHF_AUTO:
    case AL_AUXILIARY_SEND_FILTER_GAIN_AUTO:
    case AL_AUXILIARY_SEND_FILTER_GAINHF_AUTO:
    case AL_DIRECT_CHANNELS_SOFT:
    case AL_SOURCE_RESAMPLER_SOFT:
    case AL_SOURCE_SPATIALIZE_SOFT:
        CHECKSIZE(values, 1);
        ival = static_cast<int>(values[0]);
        return SetSourceiv(Source, Context, prop, {&ival, 1u});

    case AL_BUFFERS_QUEUED:
    case AL_BUFFERS_PROCESSED:
        CHECKSIZE(values, 1);
        ival = static_cast<int>(static_cast<ALuint>(values[0]));
        return SetSourceiv(Source, Context, prop, {&ival, 1u});

    case AL_BUFFER:
    case AL_DIRECT_FILTER:
    case AL_AUXILIARY_SEND_FILTER:
    case AL_SAMPLE_OFFSET_LATENCY_SOFT:
    case AL_SAMPLE_OFFSET_CLOCK_SOFT:
        break;
    }

    ERR("Unexpected property: 0x%04x\n", prop);
    Context->setError(AL_INVALID_ENUM, "Invalid source float property 0x%04x", prop);
    return false;
}